

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezc3d.cpp
# Opt level: O3

void __thiscall
ezc3d::c3d::analog(c3d *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *channelNames)

{
  size_t sVar1;
  Analogs *this_00;
  size_t sf;
  ulong uVar2;
  Channel emptyChannel;
  SubFrame dummy_subframes;
  vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_> dummy_frames;
  Frame frame;
  Channel CStack_98;
  SubFrame local_90;
  vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_> local_78;
  Frame local_58;
  
  sVar1 = DataNS::Data::nbFrames
                    ((this->_data).
                     super___shared_ptr<ezc3d::DataNS::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (sVar1 == 0) {
    local_58._points.
    super___shared_ptr<ezc3d::DataNS::Points3dNS::Points,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_58._points.
    super___shared_ptr<ezc3d::DataNS::Points3dNS::Points,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58._analogs.
    super___shared_ptr<ezc3d::DataNS::AnalogsNS::Analogs,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    updateParameters(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_58,channelNames);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_58);
  }
  else {
    local_78.super__Vector_base<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super__Vector_base<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    DataNS::AnalogsNS::SubFrame::SubFrame(&local_90);
    DataNS::AnalogsNS::Channel::Channel(&CStack_98);
    DataNS::AnalogsNS::Channel::data(&CStack_98,0.0);
    DataNS::Frame::Frame(&local_58);
    if ((channelNames->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish !=
        (channelNames->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      uVar2 = 0;
      do {
        DataNS::AnalogsNS::SubFrame::channel(&local_90,&CStack_98,0xffffffffffffffff);
        uVar2 = uVar2 + 1;
      } while (uVar2 < (ulong)((long)(channelNames->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(channelNames->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    uVar2 = 0;
    while( true ) {
      sVar1 = Header::nbAnalogByFrame
                        ((this->_header).
                         super___shared_ptr<ezc3d::Header,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if (sVar1 <= uVar2) break;
      this_00 = DataNS::Frame::analogs(&local_58);
      DataNS::AnalogsNS::Analogs::subframe(this_00,&local_90,0xffffffffffffffff);
      uVar2 = uVar2 + 1;
    }
    uVar2 = 0;
    while( true ) {
      sVar1 = DataNS::Data::nbFrames
                        ((this->_data).
                         super___shared_ptr<ezc3d::DataNS::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      if (sVar1 <= uVar2) break;
      std::vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>::push_back
                (&local_78,&local_58);
      uVar2 = uVar2 + 1;
    }
    analog(this,channelNames,&local_78);
    if (local_58._rotations.
        super___shared_ptr<ezc3d::DataNS::RotationNS::Rotations,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58._rotations.
                 super___shared_ptr<ezc3d::DataNS::RotationNS::Rotations,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_58._analogs.
        super___shared_ptr<ezc3d::DataNS::AnalogsNS::Analogs,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58._analogs.
                 super___shared_ptr<ezc3d::DataNS::AnalogsNS::Analogs,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_58._points.
        super___shared_ptr<ezc3d::DataNS::Points3dNS::Points,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58._points.
                 super___shared_ptr<ezc3d::DataNS::Points3dNS::Points,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_90._channels.
        super__Vector_base<ezc3d::DataNS::AnalogsNS::Channel,_std::allocator<ezc3d::DataNS::AnalogsNS::Channel>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90._channels.
                      super__Vector_base<ezc3d::DataNS::AnalogsNS::Channel,_std::allocator<ezc3d::DataNS::AnalogsNS::Channel>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_90._channels.
                            super__Vector_base<ezc3d::DataNS::AnalogsNS::Channel,_std::allocator<ezc3d::DataNS::AnalogsNS::Channel>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90._channels.
                            super__Vector_base<ezc3d::DataNS::AnalogsNS::Channel,_std::allocator<ezc3d::DataNS::AnalogsNS::Channel>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>::~vector(&local_78);
  }
  return;
}

Assistant:

void ezc3d::c3d::analog(const std::vector<std::string> &channelNames) {
  if (data().nbFrames() > 0) {
    std::vector<ezc3d::DataNS::Frame> dummy_frames;
    ezc3d::DataNS::AnalogsNS::SubFrame dummy_subframes;
    ezc3d::DataNS::AnalogsNS::Channel emptyChannel;
    emptyChannel.data(0);
    ezc3d::DataNS::Frame frame;
    for (size_t i = 0; i < channelNames.size(); ++i) {
      dummy_subframes.channel(emptyChannel);
    }
    for (size_t sf = 0; sf < header().nbAnalogByFrame(); ++sf)
      frame.analogs().subframe(dummy_subframes);
    for (size_t f = 0; f < data().nbFrames(); ++f)
      dummy_frames.push_back(frame);
    analog(channelNames, dummy_frames);
  } else {
    updateParameters({}, channelNames);
  }
}